

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_shuffle_4bytes(char *heap,LONGLONG length,int *status)

{
  undefined1 *__src;
  int *in_RDX;
  long in_RSI;
  undefined1 *in_RDI;
  char *heapptr;
  char *cptr;
  char *ptr;
  LONGLONG ii;
  undefined1 *local_40;
  undefined1 *local_38;
  long local_28;
  int local_4;
  
  __src = (undefined1 *)malloc(in_RSI << 2);
  if (__src == (undefined1 *)0x0) {
    ffpmsg((char *)0x1e5a3a);
    local_4 = *in_RDX;
  }
  else {
    local_40 = in_RDI;
    local_38 = __src;
    for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 1) {
      *local_38 = *local_40;
      local_38[in_RSI] = local_40[1];
      local_38[in_RSI * 2] = local_40[2];
      local_38[in_RSI * 3] = local_40[3];
      local_40 = local_40 + 4;
      local_38 = local_38 + 1;
    }
    memcpy(in_RDI,__src,in_RSI << 2);
    free(__src);
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

static int fits_shuffle_4bytes(char *heap, LONGLONG length, int *status)

/* shuffle the bytes in an array of 4-byte integers or floats  */

{
    LONGLONG ii;
    char *ptr, *cptr, *heapptr;
    
    ptr = malloc((size_t) (length * 4));
    if (!ptr) {
      ffpmsg("malloc failed\n");
      return(*status);
    }

    heapptr = heap;
    cptr = ptr;
 
    for (ii = 0; ii < length; ii++) {
       *cptr = *heapptr;
       heapptr++;
       *(cptr + length) = *heapptr;
       heapptr++;
       *(cptr + (length * 2)) = *heapptr;
       heapptr++;
       *(cptr + (length * 3)) = *heapptr;
       heapptr++;
       cptr++;
    }
        
    memcpy(heap, ptr, (size_t) (length * 4));
    free(ptr);

    return(*status);
}